

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_compare.cpp
# Opt level: O2

bool Omega_h::CompareArrays<signed_char>::compare
               (CommPtr *comm,Read<signed_char> *a,Read<signed_char> *b,VarCompareOpts opts,
               Int ncomps,Int dim,bool verbose)

{
  Comm *this;
  bool x;
  bool bVar1;
  LO LVar2;
  I32 IVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  long lVar7;
  HostRead<signed_char> h_a;
  HostRead<signed_char> h_b;
  Write<signed_char> local_70;
  Write<signed_char> local_60;
  Write<signed_char> local_50;
  Write<signed_char> local_40;
  
  if (opts.type == NONE) {
    bVar1 = true;
  }
  else {
    Write<signed_char>::Write(&local_50,&a->write_);
    Write<signed_char>::Write(&local_60,&b->write_);
    x = operator==((Read<signed_char> *)&local_50,(Read<signed_char> *)&local_60);
    Write<signed_char>::~Write(&local_60);
    Write<signed_char>::~Write(&local_50);
    bVar1 = Comm::reduce_and((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,x);
    if (verbose && !bVar1) {
      Write<signed_char>::Write(&local_40,&a->write_);
      HostRead<signed_char>::HostRead(&h_a,(Read<signed_char> *)&local_40);
      Write<signed_char>::~Write(&local_40);
      Write<signed_char>::Write(&local_70,&b->write_);
      HostRead<signed_char>::HostRead(&h_b,(Read<signed_char> *)&local_70);
      Write<signed_char>::~Write(&local_70);
      this = (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      LVar2 = HostRead<signed_char>::size(&h_a);
      Comm::exscan<long>(this,(long)LVar2,OMEGA_H_SUM);
      IVar3 = 0x7fffffff;
      if (!x) {
        IVar3 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr);
      }
      iVar4 = Comm::allreduce<int>
                        ((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr,IVar3,OMEGA_H_MIN);
      IVar3 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      if (IVar3 == iVar4) {
        lVar7 = 0;
        while( true ) {
          LVar2 = HostRead<signed_char>::size(&h_a);
          if (LVar2 <= lVar7) break;
          if (*(char *)((long)h_a.read_.write_.shared_alloc_.direct_ptr + lVar7) !=
              *(char *)((long)h_b.read_.write_.shared_alloc_.direct_ptr + lVar7)) {
            pcVar5 = dimensional_singular_name(dim);
            poVar6 = std::operator<<((ostream *)&std::cout,pcVar5);
            poVar6 = std::operator<<(poVar6,' ');
            poVar6 = std::ostream::_M_insert<long>((long)poVar6);
            poVar6 = std::operator<<(poVar6," comp ");
            poVar6 = std::ostream::_M_insert<long>((long)poVar6);
            poVar6 = std::operator<<(poVar6," ");
            poVar6 = std::ostream::_M_insert<long>((long)poVar6);
            poVar6 = std::operator<<(poVar6," != ");
            poVar6 = std::ostream::_M_insert<long>((long)poVar6);
            std::operator<<(poVar6,'\n');
            break;
          }
          lVar7 = lVar7 + 1;
        }
      }
      Write<signed_char>::~Write((Write<signed_char> *)&h_b);
      Write<signed_char>::~Write((Write<signed_char> *)&h_a);
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

static bool compare(CommPtr comm, Read<T> a, Read<T> b, VarCompareOpts opts,
      Int ncomps, Int dim, bool verbose) {
    if (opts.type == VarCompareOpts::NONE) return true;
    auto this_rank_matches = (a == b);
    if (comm->reduce_and(this_rank_matches)) return true;
    if (!verbose) return false;
    /* if integer arrays are different, we find the first mismatching
       value and print it out as a place for users to start
       tracking down the issue */
    auto h_a = HostRead<T>(a);
    auto h_b = HostRead<T>(b);
    auto global_start = comm->exscan(GO(h_a.size()), OMEGA_H_SUM);
    I32 rank_cand = ArithTraits<I32>::max();
    if (!this_rank_matches) rank_cand = comm->rank();
    // only the first mismatching rank prints
    auto best_rank = comm->allreduce(rank_cand, OMEGA_H_MIN);
    if (comm->rank() == best_rank) {
      for (LO j = 0; j < h_a.size(); ++j) {
        // and it only prints its first mismatching value
        if (h_a[j] != h_b[j]) {
          auto global_comp = global_start + GO(j);
          auto global_ent = global_comp / ncomps;
          auto comp = global_comp % ncomps;
          std::cout << dimensional_singular_name(dim) << ' ' << global_ent
                    << " comp " << comp << " " << I64(h_a[j])
                    << " != " << I64(h_b[j]) << '\n';
          break;
        }
      }
    }
    return false;
  }